

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O2

int __thiscall CTcSymPropBase::write_to_sym_file(CTcSymPropBase *this,CVmFile *fp)

{
  CTcSymbolBase::write_to_file_gen((CTcSymbolBase *)this,fp);
  CVmFile::write_byte(fp,this->field_0x2a & 7);
  return 1;
}

Assistant:

int CTcSymPropBase::write_to_sym_file(CVmFile *fp)
{
    /* inherit the default handling */
    int ret = CTcSymbol::write_to_sym_file(fp);
    if (ret)
    {
        /* encode and write our flags */
        char flags = 0;
        if (ref_)
            flags |= 1;
        if (vocab_)
            flags |= 2;
        if (weak_)
            flags |= 4;
        
        fp->write_byte(flags);
    }

    return ret;
}